

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMeshControl::TPZMHMeshControl
          (TPZMHMeshControl *this,TPZAutoPointer<TPZGeoMesh> *gmesh,TPZVec<long> *geotomhm)

{
  atomic_int *paVar1;
  TPZAutoPointer<TPZCompMesh> *this_00;
  _Rb_tree_header *p_Var2;
  TPZReference *pTVar3;
  mapped_type_conflict *pmVar4;
  TPZMultiphysicsCompMesh *this_01;
  long lVar5;
  long lVar6;
  bool bVar7;
  TPZAutoPointer<TPZGeoMesh> local_50;
  TPZManVector<long,_10> *local_48;
  TPZAutoPointer<TPZCompMesh> *local_40;
  TPZAutoPointer<TPZCompMesh> *local_38;
  
  this->_vptr_TPZMHMeshControl = (_func_int **)&PTR__TPZMHMeshControl_01815f70;
  pTVar3 = gmesh->fRef;
  (this->fGMesh).fRef = pTVar3;
  LOCK();
  paVar1 = &pTVar3->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  this_00 = &this->fCMesh;
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(this_00);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(&this->fCMeshLagrange);
  local_38 = &this->fCMeshLagrange;
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(&this->fCMeshConstantPressure);
  local_40 = &this->fCMeshConstantPressure;
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(&this->fPressureFineMesh);
  this->fProblemType = EScalar;
  this->fNState = 1;
  this->fSkeletonMatId = 4;
  this->fSecondSkeletonMatId = 3;
  this->fPressureSkeletonMatId = 6;
  this->fLagrangeMatIdLeft = 0x226;
  this->fLagrangeMatIdRight = 0x227;
  p_Var2 = &(this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &(this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fpOrderInternal = 1;
  this->fpOrderSkeleton = 1;
  this->fHdivmaismais = 0;
  this->fSkeletonWrapMatId = 500;
  this->fBoundaryWrapMatId = 0x1f6;
  this->fInternalWrapMatId = 0x1f5;
  local_48 = &this->fGeoToMHMDomain;
  TPZManVector<long,_10>::TPZManVector(local_48,geotomhm);
  p_Var2 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
  *(undefined1 (*) [16])&(this->fMHMtoSubCMesh)._M_t._M_impl = (undefined1  [16])0x0;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)
   ((long)&(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count +
   7) = 0;
  this->fNumeq = -1;
  *(undefined4 *)&this->fGlobalSystemSize = 0xffffffff;
  *(undefined4 *)((long)&this->fGlobalSystemSize + 4) = 0xffffffff;
  *(undefined4 *)&this->fGlobalSystemWithLocalCondensationSize = 0xffffffff;
  *(undefined4 *)((long)&this->fGlobalSystemWithLocalCondensationSize + 4) = 0xffffffff;
  if ((gmesh->fRef != (TPZReference *)0x0) && (gmesh->fRef->fPointer != (TPZGeoMesh *)0x0)) {
    this->fpOrderInternal = 2;
    this->fpOrderSkeleton = 1;
    lVar5 = 0;
    lVar6 = geotomhm->fNElements;
    if (geotomhm->fNElements < 1) {
      lVar6 = lVar5;
    }
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      pmVar4 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](&this->fMHMtoSubCMesh,
                            (key_type_conflict1 *)((long)geotomhm->fStore + lVar5));
      *pmVar4 = -1;
      lVar5 = lVar5 + 8;
    }
    this_01 = (TPZMultiphysicsCompMesh *)operator_new(0x9a8);
    local_50.fRef = (this->fGMesh).fRef;
    LOCK();
    ((local_50.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_50.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh(this_01,&local_50);
    TPZAutoPointer<TPZCompMesh>::operator=(this_00,this_01);
    TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer(&local_50);
    this_00->fRef->fPointer->fDimModel = ((this->fGMesh).fRef)->fPointer->fDim;
    TPZAutoPointer<TPZCompMesh>::operator=(&this->fPressureFineMesh,this_00);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
             ,0x29);
}

Assistant:

TPZMHMeshControl::TPZMHMeshControl(TPZAutoPointer<TPZGeoMesh> gmesh, TPZVec<int64_t> &geotomhm) : fGMesh(gmesh), fProblemType(EScalar), fNState(1), fGeoToMHMDomain(geotomhm), fMHMtoSubCMesh(), fGlobalSystemSize(-1), fGlobalSystemWithLocalCondensationSize(-1), fNumeq(-1)
{
    if(!gmesh) DebugStop();
#ifdef PZDEBUG
    if (geotomhm.size() != fGMesh->NElements()) {
        DebugStop();
    }
#endif
    fpOrderInternal = 2;
    fpOrderSkeleton = 1;

    int64_t nc = geotomhm.size();
    for (int64_t c=0; c<nc; c++) {
        fMHMtoSubCMesh[geotomhm[c] ] = -1;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Coarse element indexes ";
        for (std::map<int64_t,int64_t>::iterator it=fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            sout << *it << " ";
        }
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fCMesh = new TPZMultiphysicsCompMesh(fGMesh);
    fCMesh->SetDimModel(fGMesh->Dimension());
    fPressureFineMesh = fCMesh;
}